

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::HlslParseContext::handleVariable(HlslParseContext *this,TSourceLoc *loc,TString *string)

{
  TIntermediate *pTVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TIntermTyped *pTVar7;
  undefined4 extraout_var_03;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_00;
  const_reference pvVar8;
  undefined4 extraout_var_04;
  char *pcVar9;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  TTypeList *pTVar10;
  TVariable *this_01;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  TQualifier *pTVar11;
  TString *pTVar12;
  TAnonMember *local_138;
  TIntermTyped *local_110;
  TType local_f8;
  TIntermConstantUnion *local_60;
  TIntermTyped *constNode;
  TIntermTyped *container;
  TIntermTyped *node;
  TAnonMember *anon;
  TVariable *variable;
  TSymbol *symbol;
  TString *pTStack_28;
  int thisDepth;
  TString *string_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  pTStack_28 = string;
  string_local = (TString *)loc;
  loc_local = (TSourceLoc *)this;
  variable = (TVariable *)
             TSymbolTable::find((this->super_TParseContextBase).symbolTable,string,
                                (int *)((long)&symbol + 4));
  if ((variable != (TVariable *)0x0) &&
     (iVar3 = (*(variable->super_TSymbol)._vptr_TSymbol[9])(), CONCAT44(extraout_var,iVar3) != 0)) {
    iVar3 = (*(variable->super_TSymbol)._vptr_TSymbol[9])();
    uVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0xb0))();
    pTVar12 = string_local;
    if ((uVar6 & 1) != 0) {
      pcVar9 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         (pTStack_28);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar12,"expected symbol, not user-defined type",pcVar9,"");
      return (TIntermTyped *)0x0;
    }
  }
  anon = (TAnonMember *)0x0;
  if (variable == (TVariable *)0x0) {
    local_110 = (TIntermTyped *)0x0;
  }
  else {
    iVar3 = (*(variable->super_TSymbol)._vptr_TSymbol[0xb])();
    local_110 = (TIntermTyped *)CONCAT44(extraout_var_01,iVar3);
  }
  node = local_110;
  container = (TIntermTyped *)0x0;
  if (local_110 != (TIntermTyped *)0x0) {
    if ((0 < symbol._4_4_) &&
       (anon = (TAnonMember *)getImplicitThis(this,symbol._4_4_),
       (TVariable *)anon == (TVariable *)0x0)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,string_local,"cannot access member variables (static member function?)","this"
                 ,"");
    }
    if (anon == (TAnonMember *)0x0) {
      iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x16])();
      anon = (TAnonMember *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x50))();
    }
    constNode = &TIntermediate::addSymbol
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                            (TVariable *)anon,(TSourceLoc *)string_local)->super_TIntermTyped;
    pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    uVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x17])();
    local_60 = TIntermediate::addConstantUnion(pTVar1,uVar4,(TSourceLoc *)string_local,false);
    pTVar7 = TIntermediate::addIndex
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                        EOpIndexDirectStruct,constNode,&local_60->super_TIntermTyped,
                        (TSourceLoc *)string_local);
    container = pTVar7;
    iVar3 = (*(anon->super_TSymbol)._vptr_TSymbol[0xc])();
    this_00 = &TType::getStruct((TType *)CONCAT44(extraout_var_03,iVar3))->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
    uVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x17])();
    pvVar8 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::operator[]
                       (this_00,(ulong)uVar4);
    (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x1d])(pTVar7,pvVar8->type);
    iVar3 = (*(container->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    uVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar3) + 0x18))();
    pTVar12 = string_local;
    if ((uVar6 & 1) != 0) {
      pcVar9 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         (pTStack_28);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar12,"member of nameless block was not redeclared",pcVar9,"");
    }
    goto LAB_00629cc8;
  }
  if (variable == (TVariable *)0x0) {
    local_138 = (TAnonMember *)0x0;
  }
  else {
    iVar3 = (*(variable->super_TSymbol)._vptr_TSymbol[9])();
    local_138 = (TAnonMember *)CONCAT44(extraout_var_05,iVar3);
  }
  pTVar12 = string_local;
  anon = local_138;
  if (local_138 == (TAnonMember *)0x0) {
    if (variable != (TVariable *)0x0) {
      pcVar9 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         (pTStack_28);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar12,"variable name expected",pcVar9);
    }
  }
  else {
    iVar3 = (*(local_138->super_TSymbol)._vptr_TSymbol[0xc])();
    iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar3) + 0x38))();
    if (iVar3 != 0x10) {
      iVar3 = (*(anon->super_TSymbol)._vptr_TSymbol[0xc])();
      iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar3) + 0x38))();
      if (iVar3 != 0xf) goto LAB_00629b79;
    }
    iVar3 = (*(anon->super_TSymbol)._vptr_TSymbol[0xc])();
    pTVar10 = TType::getStruct((TType *)CONCAT44(extraout_var_08,iVar3));
    pTVar12 = string_local;
    if (pTVar10 == (TTypeList *)0x0) {
      pcVar9 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         (pTStack_28);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar12,"cannot be used (maybe an instance name is needed)",pcVar9);
      anon = (TAnonMember *)0x0;
    }
  }
LAB_00629b79:
  pTVar12 = string_local;
  if (anon == (TAnonMember *)0x0) {
    pcVar9 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       (pTStack_28);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,pTVar12,"unknown variable",pcVar9,"");
    this_01 = (TVariable *)TSymbol::operator_new((TSymbol *)0xf8,(size_t)pTVar12);
    pTVar12 = pTStack_28;
    TType::TType(&local_f8,EbtVoid,EvqTemporary,1,0,0,false);
    TVariable::TVariable(this_01,pTVar12,&local_f8,false);
    anon = (TAnonMember *)this_01;
    TType::~TType(&local_f8);
  }
  iVar3 = (*(anon->super_TSymbol)._vptr_TSymbol[0xc])();
  pTVar11 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_09,iVar3) + 0x58))();
  bVar2 = TQualifier::isFrontEndConstant(pTVar11);
  if (bVar2) {
    pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    iVar3 = (*(anon->super_TSymbol)._vptr_TSymbol[0x17])();
    iVar5 = (*(anon->super_TSymbol)._vptr_TSymbol[0xc])();
    container = &TIntermediate::addConstantUnion
                           (pTVar1,(TConstUnionArray *)CONCAT44(extraout_var_10,iVar3),
                            (TType *)CONCAT44(extraout_var_11,iVar5),(TSourceLoc *)string_local,
                            false)->super_TIntermTyped;
  }
  else {
    container = &TIntermediate::addSymbol
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                            (TVariable *)anon,(TSourceLoc *)string_local)->super_TIntermTyped;
  }
LAB_00629cc8:
  iVar3 = (*(anon->super_TSymbol)._vptr_TSymbol[0xc])();
  pTVar11 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_12,iVar3) + 0x58))();
  bVar2 = TQualifier::isIo(pTVar11);
  if (bVar2) {
    TIntermediate::addIoAccessed
              ((this->super_TParseContextBase).super_TParseVersions.intermediate,pTStack_28);
  }
  return container;
}

Assistant:

TIntermTyped* HlslParseContext::handleVariable(const TSourceLoc& loc, const TString* string)
{
    int thisDepth;
    TSymbol* symbol = symbolTable.find(*string, thisDepth);
    if (symbol && symbol->getAsVariable() && symbol->getAsVariable()->isUserType()) {
        error(loc, "expected symbol, not user-defined type", string->c_str(), "");
        return nullptr;
    }

    const TVariable* variable = nullptr;
    const TAnonMember* anon = symbol ? symbol->getAsAnonMember() : nullptr;
    TIntermTyped* node = nullptr;
    if (anon) {
        // It was a member of an anonymous container, which could be a 'this' structure.

        // Create a subtree for its dereference.
        if (thisDepth > 0) {
            variable = getImplicitThis(thisDepth);
            if (variable == nullptr)
                error(loc, "cannot access member variables (static member function?)", "this", "");
        }
        if (variable == nullptr)
            variable = anon->getAnonContainer().getAsVariable();

        TIntermTyped* container = intermediate.addSymbol(*variable, loc);
        TIntermTyped* constNode = intermediate.addConstantUnion(anon->getMemberNumber(), loc);
        node = intermediate.addIndex(EOpIndexDirectStruct, container, constNode, loc);

        node->setType(*(*variable->getType().getStruct())[anon->getMemberNumber()].type);
        if (node->getType().hiddenMember())
            error(loc, "member of nameless block was not redeclared", string->c_str(), "");
    } else {
        // Not a member of an anonymous container.

        // The symbol table search was done in the lexical phase.
        // See if it was a variable.
        variable = symbol ? symbol->getAsVariable() : nullptr;
        if (variable) {
            if ((variable->getType().getBasicType() == EbtBlock ||
                variable->getType().getBasicType() == EbtStruct) && variable->getType().getStruct() == nullptr) {
                error(loc, "cannot be used (maybe an instance name is needed)", string->c_str(), "");
                variable = nullptr;
            }
        } else {
            if (symbol)
                error(loc, "variable name expected", string->c_str(), "");
        }

        // Recovery, if it wasn't found or was not a variable.
        if (variable == nullptr) {
            error(loc, "unknown variable", string->c_str(), "");
            variable = new TVariable(string, TType(EbtVoid));
        }

        if (variable->getType().getQualifier().isFrontEndConstant())
            node = intermediate.addConstantUnion(variable->getConstArray(), variable->getType(), loc);
        else
            node = intermediate.addSymbol(*variable, loc);
    }

    if (variable->getType().getQualifier().isIo())
        intermediate.addIoAccessed(*string);

    return node;
}